

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O2

void __thiscall
cmParseCoberturaCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  string *__k;
  cmCTest *pcVar1;
  pointer pbVar2;
  char *__s1;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  long lVar8;
  mapped_type *pmVar9;
  pointer pbVar10;
  char **ppcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  string filename;
  string finalpath;
  string FoundSource;
  string line;
  ifstream fin;
  byte abStack_218 [488];
  
  FoundSource._M_dataplus._M_p = (pointer)&FoundSource.field_2;
  FoundSource._M_string_length = 0;
  FoundSource.field_2._M_local_buf[0] = '\0';
  finalpath._M_dataplus._M_p = (pointer)&finalpath.field_2;
  finalpath._M_string_length = 0;
  finalpath.field_2._M_local_buf[0] = '\0';
  bVar3 = std::operator==(name,"source");
  if (bVar3) {
    this->InSource = true;
    goto LAB_001713f6;
  }
  bVar3 = std::operator==(name,"sources");
  if (bVar3) {
    this->InSources = true;
    goto LAB_001713f6;
  }
  bVar3 = std::operator==(name,"class");
  if (!bVar3) {
    bVar3 = std::operator==(name,"line");
    if ((bVar3) && (this->SkipThisClass == false)) {
      ppcVar11 = atts + 1;
      uVar6 = 0xffffffff;
      iVar4 = -1;
      do {
        __s1 = ppcVar11[-1];
        iVar5 = strcmp(__s1,"hits");
        if (iVar5 == 0) {
          iVar4 = atoi(*ppcVar11);
        }
        else {
          iVar5 = strcmp(__s1,"number");
          if (iVar5 == 0) {
            uVar6 = atoi(*ppcVar11);
          }
        }
        ppcVar11 = ppcVar11 + 1;
      } while ((int)uVar6 < 1 || iVar4 < 0);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&this->Coverage->TotalCoverage,&this->CurFileName);
      (pmVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[(ulong)uVar6 - 1] = iVar4;
    }
    goto LAB_001713f6;
  }
  do {
    iVar4 = strcmp(*atts,"filename");
    atts = atts + 1;
  } while (iVar4 != 0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
  poVar7 = std::operator<<((ostream *)&fin,"Reading file: ");
  poVar7 = std::operator<<(poVar7,*atts);
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseCoberturaCoverage.cxx"
               ,0x3d,line._M_dataplus._M_p,this->Coverage->Quiet);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fin);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,*atts,(allocator<char> *)&fin);
  __k = &this->CurFileName;
  (this->CurFileName)._M_string_length = 0;
  *(this->CurFileName)._M_dataplus._M_p = '\0';
  pbVar10 = (this->FilePaths).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->FilePaths).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar10 == pbVar2) goto LAB_001710c1;
    lVar8 = std::__cxx11::string::find((string *)&filename,(ulong)pbVar10);
    pbVar10 = pbVar10 + 1;
  } while (lVar8 != 0);
  std::__cxx11::string::_M_assign((string *)__k);
LAB_001710c1:
  if ((this->CurFileName)._M_string_length == 0) {
    pbVar10 = (this->FilePaths).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->FilePaths).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pbVar10 == pbVar2) goto LAB_00171154;
      std::operator+(&line,pbVar10,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin,&line
                     ,&filename);
      std::__cxx11::string::operator=((string *)&finalpath,(string *)&fin);
      std::__cxx11::string::~string((string *)&fin);
      std::__cxx11::string::~string((string *)&line);
      bVar3 = cmsys::SystemTools::FileExists(&finalpath);
      pbVar10 = pbVar10 + 1;
    } while (!bVar3);
    std::__cxx11::string::_M_assign((string *)__k);
  }
LAB_00171154:
  std::ifstream::ifstream(&fin,(__k->_M_dataplus)._M_p,_S_in);
  if (((this->CurFileName)._M_string_length == 0) ||
     ((abStack_218[*(long *)(_fin + -0x18)] & 5) != 0)) {
    std::operator+(&local_430,&this->Coverage->BinaryDir,"/");
    std::operator+(&line,&local_430,*atts);
    std::__cxx11::string::operator=((string *)__k,(string *)&line);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::~string((string *)&local_430);
    std::ifstream::open((char *)&fin,(_Ios_Openmode)(__k->_M_dataplus)._M_p);
    if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) goto LAB_00171365;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&line);
    poVar7 = std::operator<<((ostream *)&line,"Skipping system file ");
    poVar7 = std::operator<<(poVar7,(string *)&filename);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseCoberturaCoverage.cxx"
                 ,0x5f,(char *)CONCAT44(local_430._M_dataplus._M_p._4_4_,
                                        local_430._M_dataplus._M_p._0_4_),this->Coverage->Quiet);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&line);
    this->SkipThisClass = true;
  }
  else {
LAB_00171365:
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](&this->Coverage->TotalCoverage,__k);
    while (bVar3 = cmsys::SystemTools::GetLineFromStream((istream *)&fin,&line,(bool *)0x0,-1),
          bVar3) {
      local_430._M_dataplus._M_p._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pmVar9,(int *)&local_430);
    }
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&filename);
LAB_001713f6:
  std::__cxx11::string::~string((string *)&finalpath);
  std::__cxx11::string::~string((string *)&FoundSource);
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) override
  {
    std::string FoundSource;
    std::string finalpath;
    if (name == "source") {
      this->InSource = true;
    } else if (name == "sources") {
      this->InSources = true;
    } else if (name == "class") {
      int tagCount = 0;
      while (true) {
        if (strcmp(atts[tagCount], "filename") == 0) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Reading file: " << atts[tagCount + 1]
                                              << std::endl,
                             this->Coverage.Quiet);
          std::string filename = atts[tagCount + 1];
          this->CurFileName.clear();

          // Check if this is an absolute path that falls within our
          // source or binary directories.
          for (std::string const& filePath : FilePaths) {
            if (filename.find(filePath) == 0) {
              this->CurFileName = filename;
              break;
            }
          }

          if (this->CurFileName.empty()) {
            // Check if this is a path that is relative to our source or
            // binary directories.
            for (std::string const& filePath : FilePaths) {
              finalpath = filePath + "/" + filename;
              if (cmSystemTools::FileExists(finalpath)) {
                this->CurFileName = finalpath;
                break;
              }
            }
          }

          cmsys::ifstream fin(this->CurFileName.c_str());
          if (this->CurFileName.empty() || !fin) {
            this->CurFileName =
              this->Coverage.BinaryDir + "/" + atts[tagCount + 1];
            fin.open(this->CurFileName.c_str());
            if (!fin) {
              cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                                 "Skipping system file " << filename
                                                         << std::endl,
                                 this->Coverage.Quiet);

              this->SkipThisClass = true;
              break;
            }
          }
          std::string line;
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          while (cmSystemTools::GetLineFromStream(fin, line)) {
            curFileLines.push_back(-1);
          }

          break;
        }
        ++tagCount;
      }
    } else if (name == "line") {
      int tagCount = 0;
      int curNumber = -1;
      int curHits = -1;
      while (true) {
        if (this->SkipThisClass) {
          break;
        }
        if (strcmp(atts[tagCount], "hits") == 0) {
          curHits = atoi(atts[tagCount + 1]);
        } else if (strcmp(atts[tagCount], "number") == 0) {
          curNumber = atoi(atts[tagCount + 1]);
        }

        if (curHits > -1 && curNumber > 0) {
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          {
            curFileLines[curNumber - 1] = curHits;
          }
          break;
        }
        ++tagCount;
      }
    }
  }